

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

double __thiscall
gl4cts::EnhancedLayouts::Utils::Program::BuildException::log(BuildException *this,double __x)

{
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar1;
  Context *in_RSI;
  double extraout_XMM0_Qa;
  MessageBuilder local_198;
  Context *local_18;
  Context *context_local;
  BuildException *this_local;
  
  local_18 = in_RSI;
  context_local = (Context *)this;
  this_00 = deqp::Context::getTestContext(in_RSI);
  this_01 = tcu::TestContext::getLog(this_00);
  tcu::TestLog::operator<<(&local_198,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar1 = tcu::MessageBuilder::operator<<(&local_198,(char (*) [15])"Link failure: ");
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&this->m_error_message);
  tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_198);
  Utils::Shader::LogSource(local_18,&this->m_vertex_shader,VERTEX);
  Utils::Shader::LogSource(local_18,&this->m_tess_ctrl_shader,TESS_CTRL);
  Utils::Shader::LogSource(local_18,&this->m_tess_eval_shader,TESS_EVAL);
  Utils::Shader::LogSource(local_18,&this->m_geometry_shader,GEOMETRY);
  Utils::Shader::LogSource(local_18,&this->m_fragment_shader,FRAGMENT);
  Utils::Shader::LogSource(local_18,&this->m_compute_shader,COMPUTE);
  return extraout_XMM0_Qa;
}

Assistant:

void Program::BuildException::log(deqp::Context& context) const
{
	context.getTestContext().getLog() << tcu::TestLog::Message << "Link failure: " << m_error_message
									  << tcu::TestLog::EndMessage;

	Shader::LogSource(context, m_vertex_shader, Shader::VERTEX);
	Shader::LogSource(context, m_tess_ctrl_shader, Shader::TESS_CTRL);
	Shader::LogSource(context, m_tess_eval_shader, Shader::TESS_EVAL);
	Shader::LogSource(context, m_geometry_shader, Shader::GEOMETRY);
	Shader::LogSource(context, m_fragment_shader, Shader::FRAGMENT);
	Shader::LogSource(context, m_compute_shader, Shader::COMPUTE);
}